

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYs<float> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  GetterXsYRef<float> *pGVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  int iVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  float fVar25;
  float fVar26;
  undefined1 auVar24 [16];
  float fVar27;
  float fVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  pIVar16 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar18 = pGVar8->Count;
  lVar19 = (long)(((pGVar8->Offset + prim) % iVar18 + iVar18) % iVar18) * (long)pGVar8->Stride;
  fVar27 = *(float *)((long)pGVar8->Ys + lVar19);
  dVar22 = log10((double)*(float *)((long)pGVar8->Xs + lVar19) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar16->CurrentPlot;
  dVar1 = pIVar16->LogDenX;
  dVar2 = (pIVar10->XAxis).Range.Min;
  dVar3 = (pIVar10->XAxis).Range.Max;
  dVar23 = log10((double)fVar27 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar18 = pTVar9->YAxis;
  pIVar10 = pIVar16->CurrentPlot;
  pGVar11 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar11->Count;
  auVar32._8_8_ = pIVar16->LogDenY[iVar18];
  auVar32._0_8_ = dVar1;
  auVar28._8_8_ = dVar23;
  auVar28._0_8_ = dVar22;
  dVar1 = pGVar11->YRef;
  auVar29 = divpd(auVar28,auVar32);
  dVar22 = pIVar10->YAxis[iVar18].Range.Min;
  IVar4 = pIVar16->PixelRange[iVar18].Min;
  fVar20 = (float)(pIVar16->Mx *
                   (((double)(float)auVar29._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  fVar25 = (float)(pIVar16->My[iVar18] *
                   (((double)(float)auVar29._8_8_ * (pIVar10->YAxis[iVar18].Range.Max - dVar22) +
                    dVar22) - dVar22) + (double)IVar4.y);
  dVar23 = log10((double)*(float *)((long)pGVar11->Xs +
                                   (long)(((prim + pGVar11->Offset) % iVar5 + iVar5) % iVar5) *
                                   (long)pGVar11->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min)
  ;
  pIVar10 = pIVar17->CurrentPlot;
  dVar2 = pIVar17->LogDenX;
  dVar3 = (pIVar10->XAxis).Range.Min;
  dVar22 = (pIVar10->XAxis).Range.Max;
  auVar24._0_8_ = log10(dVar1 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar18 = pTVar9->YAxis;
  auVar24._8_8_ = dVar23;
  auVar14._8_4_ = SUB84(dVar2,0);
  auVar14._0_8_ = pIVar17->LogDenY[iVar18];
  auVar14._12_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar29 = divpd(auVar24,auVar14);
  pIVar10 = pIVar17->CurrentPlot;
  dVar1 = pIVar10->YAxis[iVar18].Range.Min;
  IVar4 = pIVar17->PixelRange[iVar18].Min;
  fVar21 = (float)(pIVar17->My[iVar18] *
                   (((double)(float)auVar29._0_8_ * (pIVar10->YAxis[iVar18].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar26 = (float)(pIVar17->Mx *
                   (((double)(float)auVar29._8_8_ * (dVar22 - dVar3) + dVar3) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  auVar33._0_4_ = ~-(uint)(fVar26 <= fVar20) & (uint)fVar26;
  auVar33._4_4_ = ~-(uint)(fVar21 <= fVar25) & (uint)fVar21;
  auVar33._8_4_ = ~-(uint)(fVar20 < fVar26) & (uint)fVar26;
  auVar33._12_4_ = ~-(uint)(fVar25 < fVar21) & (uint)fVar21;
  auVar29._4_4_ = (uint)fVar25 & -(uint)(fVar21 <= fVar25);
  auVar29._0_4_ = (uint)fVar20 & -(uint)(fVar26 <= fVar20);
  auVar29._8_4_ = (uint)fVar20 & -(uint)(fVar20 < fVar26);
  auVar29._12_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar21);
  auVar33 = auVar33 | auVar29;
  fVar27 = (cull_rect->Min).y;
  auVar15._4_8_ = auVar33._8_8_;
  auVar15._0_4_ = -(uint)(auVar33._4_4_ < fVar27);
  auVar34._0_8_ = auVar15._0_8_ << 0x20;
  auVar34._8_4_ = -(uint)(auVar33._8_4_ < (cull_rect->Max).x);
  auVar34._12_4_ = -(uint)(auVar33._12_4_ < (cull_rect->Max).y);
  auVar35._4_4_ = -(uint)(fVar27 < auVar33._4_4_);
  auVar35._0_4_ = -(uint)((cull_rect->Min).x < auVar33._0_4_);
  auVar35._8_8_ = auVar34._8_8_;
  iVar18 = movmskps((int)cull_rect,auVar35);
  if (iVar18 == 0xf) {
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar27 = fVar21 - fVar25;
    fVar30 = fVar26 - fVar20;
    fVar31 = fVar30 * fVar30 + fVar27 * fVar27;
    if (0.0 < fVar31) {
      fVar31 = 1.0 / SQRT(fVar31);
      fVar27 = fVar27 * fVar31;
      fVar30 = fVar30 * fVar31;
    }
    fVar31 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar27 = fVar31 * fVar27;
    fVar31 = fVar31 * fVar30;
    (pIVar12->pos).x = fVar27 + fVar20;
    (pIVar12->pos).y = fVar25 - fVar31;
    (pIVar12->uv).x = IVar4.x;
    (pIVar12->uv).y = IVar4.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    pIVar12[1].pos.x = fVar27 + fVar26;
    pIVar12[1].pos.y = fVar21 - fVar31;
    pIVar12[1].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar6;
    pIVar12[2].pos.x = fVar26 - fVar27;
    pIVar12[2].pos.y = fVar31 + fVar21;
    pIVar12[2].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar6;
    pIVar12[3].pos.x = fVar20 - fVar27;
    pIVar12[3].pos.y = fVar31 + fVar25;
    pIVar12[3].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = uVar7;
    puVar13[1] = uVar7 + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar13[3] = uVar7;
    puVar13[4] = uVar7 + 2;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }